

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

RESULT_TYPE __thiscall
duckdb::QuantileComposed<duckdb::MadAccessor<int,_int,_int>,_duckdb::QuantileIndirect<int>_>::
operator()(QuantileComposed<duckdb::MadAccessor<int,_int,_int>,_duckdb::QuantileIndirect<int>_>
           *this,idx_t *input)

{
  DataChunk *result;
  MadAccessor<int,_int,_int> *pMVar1;
  CURSOR *pCVar2;
  ulong seek_idx;
  reference pvVar3;
  int iVar4;
  
  pMVar1 = this->outer;
  pCVar2 = this->inner->data;
  seek_idx = *input;
  if (((pCVar2->scan).next_row_index <= seek_idx) || (seek_idx < (pCVar2->scan).current_row_index))
  {
    result = &pCVar2->page;
    ColumnDataCollection::Seek(pCVar2->inputs,seek_idx,&pCVar2->scan,result);
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    pCVar2->data = (int *)pvVar3->data;
    pvVar3 = vector<duckdb::Vector,_true>::operator[](&result->data,0);
    FlatVector::VerifyFlatVector(pvVar3);
    pCVar2->validity = &pvVar3->validity;
  }
  iVar4 = pCVar2->data[(uint)((int)seek_idx - (int)(pCVar2->scan).current_row_index)] -
          *pMVar1->median;
  if (iVar4 < 1) {
    iVar4 = -iVar4;
  }
  return iVar4;
}

Assistant:

inline RESULT_TYPE operator()(const idx_t &input) const {
		return outer(inner(input));
	}